

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void init_all_wedge_masks(void)

{
  byte bVar1;
  uint uVar2;
  wedge_masks_type *papuVar3;
  BLOCK_SIZE plane_bsize;
  uint uVar4;
  uint8_t *puVar5;
  undefined8 in_RCX;
  uint8_t *puVar6;
  uint8_t (*paauVar7) [6] [4096];
  int shift;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t (*pauVar10) [4096];
  long lVar11;
  uint8_t (*pauVar12) [4096];
  long lVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t (*paauVar16) [22] [1024];
  int m;
  ulong uVar17;
  uint8_t (*mask) [1024];
  int bs;
  
  shift = 0x10;
  pauVar10 = wedge_mask_obl[0] + 3;
  for (uVar17 = 0; uVar17 < 0x40; uVar17 = uVar17 + 2) {
    shift_copy("",*pauVar10,shift,(int)in_RCX);
    shift = shift + -1;
    shift_copy("",*pauVar10 + 0x40,shift,(int)in_RCX);
    *(uint8_t *)((long)(pauVar10 + -2) + 0x30) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x31) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x32) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x33) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x34) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x35) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x36) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x37) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x38) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x39) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x3a) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x3b) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x3c) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x3d) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x3e) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x3f) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x20) = '+';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x21) = '9';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x22) = '>';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x23) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x24) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x25) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x26) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x27) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x28) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x29) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x2a) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x2b) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x2c) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x2d) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x2e) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x2f) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x10) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x11) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x12) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x13) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x14) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x15) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x16) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x17) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x18) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x19) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x1a) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x1b) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x1c) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x1d) = '\x02';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x1e) = '\a';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x1f) = '\x15';
    *(uint8_t *)((long)(pauVar10 + -2) + 0) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 1) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 2) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 3) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 4) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 5) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 6) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 7) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 8) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 9) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 10) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0xb) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0xc) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0xd) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0xe) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0xf) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x40) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x41) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x42) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x43) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x44) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x45) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x46) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x47) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x48) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x49) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x4a) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x4b) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x4c) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x4d) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x4e) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x4f) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x50) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x51) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x52) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x53) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x54) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x55) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x56) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x57) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x58) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x59) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x5a) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x5b) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x5c) = '\0';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x5d) = '\x02';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x5e) = '\a';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x5f) = '\x15';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x60) = '+';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x61) = '9';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x62) = '>';
    *(uint8_t *)((long)(pauVar10 + -2) + 99) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 100) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x65) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x66) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x67) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x68) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x69) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x6a) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x6b) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x6c) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x6d) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x6e) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x6f) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x70) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x71) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x72) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x73) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x74) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x75) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x76) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x77) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x78) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x79) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x7a) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x7b) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x7c) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x7d) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x7e) = '@';
    *(uint8_t *)((long)(pauVar10 + -2) + 0x7f) = '@';
    pauVar10 = (uint8_t (*) [4096])(*pauVar10 + 0x80);
  }
  puVar5 = wedge_mask_obl[0][4] + 0x3f;
  puVar6 = wedge_mask_obl[0][5] + 0xfc0;
  paauVar7 = wedge_mask_obl;
  pauVar10 = wedge_mask_obl[1] + 3;
  for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 1) {
    pauVar12 = pauVar10;
    puVar14 = puVar6;
    puVar15 = puVar5;
    for (lVar13 = 0; lVar13 != 0x1000; lVar13 = lVar13 + 0x40) {
      uVar9 = pauVar12[-6][0];
      *(uint8_t *)((long)paauVar7 + lVar13 + 0x2000) = uVar9;
      uVar8 = '@' - uVar9;
      *puVar14 = uVar8;
      *puVar15 = uVar8;
      *(uint8_t *)((long)paauVar7 + lVar13 + 0x8000) = uVar8;
      (*pauVar12)[0] = uVar8;
      puVar14[0x6000] = uVar9;
      puVar15[0x6000] = uVar9;
      uVar9 = pauVar12[-8][0];
      *(uint8_t *)((long)paauVar7 + lVar13) = uVar9;
      uVar9 = '@' - uVar9;
      *(uint8_t *)((long)paauVar7 + lVar13 + 0x6000) = uVar9;
      pauVar12[-2][0] = uVar9;
      puVar15 = puVar15 + -1;
      puVar14 = puVar14 + -0x40;
      pauVar12 = (uint8_t (*) [4096])(*pauVar12 + 1);
    }
    puVar5 = puVar5 + 0x40;
    puVar6 = puVar6 + 1;
    paauVar7 = (uint8_t (*) [6] [4096])((long)paauVar7 + 1);
    pauVar10 = (uint8_t (*) [4096])(*pauVar10 + 0x40);
  }
  memset(wedge_masks,0,0x1600);
  puVar5 = wedge_mask_buf;
  for (lVar11 = 0; lVar11 != 0x16; lVar11 = lVar11 + 1) {
    uVar2 = av1_wedge_params_lookup[lVar11].wedge_types;
    if (uVar2 != 0) {
      bVar1 = block_size_wide[lVar11];
      uVar4 = (uint)block_size_high[lVar11];
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      for (uVar17 = 0; uVar2 != uVar17; uVar17 = uVar17 + 1) {
        puVar6 = get_wedge_mask_inplace((int)uVar17,0,(BLOCK_SIZE)lVar11);
        (*aom_convolve_copy)(puVar6,0x40,puVar5,(ptrdiff_t)bVar1,(int)bVar1,uVar4);
        papuVar3 = av1_wedge_params_lookup[lVar11].masks;
        (*papuVar3)[uVar17] = puVar5;
        puVar5 = puVar5 + uVar4 * bVar1;
        puVar6 = get_wedge_mask_inplace((int)uVar17,1,(BLOCK_SIZE)lVar11);
        (*aom_convolve_copy)(puVar6,0x40,puVar5,(ptrdiff_t)bVar1,(int)bVar1,uVar4);
        papuVar3[1][uVar17] = puVar5;
        puVar5 = puVar5 + uVar4 * bVar1;
      }
    }
  }
  paauVar16 = smooth_interintra_mask_buf;
  for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
    lVar13 = 0;
    mask = *paauVar16;
    for (; lVar13 != 0x16; lVar13 = lVar13 + 1) {
      plane_bsize = (BLOCK_SIZE)lVar13;
      if ((((uint)(0x10f400L >> (plane_bsize & 0x3f)) | (uint)(0x20f800L >> (plane_bsize & 0x3f))) &
          1) == 0) {
        build_smooth_interintra_mask
                  (*mask,(uint)block_size_wide[lVar13],plane_bsize,(INTERINTRA_MODE)lVar11);
      }
      mask = mask + 1;
    }
    paauVar16 = (uint8_t (*) [22] [1024])((long)paauVar16 + 0x5800);
  }
  return;
}

Assistant:

static void init_all_wedge_masks(void) {
  init_wedge_master_masks();
  init_wedge_masks();
  init_smooth_interintra_masks();
}